

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O2

void __thiscall CRegister::RegisterSendCountRequest(CRegister *this,NETADDR Addr)

{
  long lVar1;
  long in_FS_OFFSET;
  CNetChunk Packet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Packet.m_ClientID = -1;
  Packet.m_Address.type = Addr.type;
  Packet.m_Address.ip[0] = Addr.ip[0];
  Packet.m_Address.ip[1] = Addr.ip[1];
  Packet.m_Address.ip[2] = Addr.ip[2];
  Packet.m_Address.ip[3] = Addr.ip[3];
  Packet.m_Address.ip[4] = Addr.ip[4];
  Packet.m_Address.ip[5] = Addr.ip[5];
  Packet.m_Address.ip[6] = Addr.ip[6];
  Packet.m_Address.ip[7] = Addr.ip[7];
  Packet.m_Address.ip[8] = Addr.ip[8];
  Packet.m_Address.ip[9] = Addr.ip[9];
  Packet.m_Address.ip[10] = Addr.ip[10];
  Packet.m_Address.ip[0xb] = Addr.ip[0xb];
  Packet.m_Address.ip[0xc] = Addr.ip[0xc];
  Packet.m_Address.ip[0xd] = Addr.ip[0xd];
  Packet.m_Address.ip[0xe] = Addr.ip[0xe];
  Packet.m_Address.ip[0xf] = Addr.ip[0xf];
  Packet.m_Address.port = Addr.port;
  Packet.m_Address.reserved = Addr.reserved;
  Packet.m_Flags = 2;
  Packet.m_DataSize = 8;
  Packet.m_pData = SERVERBROWSE_GETCOUNT;
  CNetServer::Send(this->m_pNetServer,&Packet,0xffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRegister::RegisterSendCountRequest(NETADDR Addr)
{
	CNetChunk Packet;
	Packet.m_ClientID = -1;
	Packet.m_Address = Addr;
	Packet.m_Flags = NETSENDFLAG_CONNLESS;
	Packet.m_DataSize = sizeof(SERVERBROWSE_GETCOUNT);
	Packet.m_pData = SERVERBROWSE_GETCOUNT;
	m_pNetServer->Send(&Packet);
}